

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

int Hand::exchange(Hand *hand,Deck *deck,vector<CardType,_std::allocator<CardType>_> *givenCards)

{
  value_type vVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  Deck *pDVar3;
  size_type sVar4;
  reference pvVar5;
  length_error *handLength_1;
  int local_64;
  int armiesToExchange_1;
  length_error *handLength;
  vector<CardType,_std::allocator<CardType>_> local_48;
  int local_2c;
  vector<CardType,_std::allocator<CardType>_> *pvStack_28;
  int armiesToExchange;
  vector<CardType,_std::allocator<CardType>_> *givenCards_local;
  Deck *deck_local;
  Hand *hand_local;
  
  pvStack_28 = givenCards;
  givenCards_local = (vector<CardType,_std::allocator<CardType>_> *)deck;
  deck_local = (Deck *)hand;
  sVar4 = std::vector<CardType,_std::allocator<CardType>_>::size(givenCards);
  if (sVar4 == 3) {
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,0);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,1);
    if (vVar1 == *pvVar5) {
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,1);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,2);
      if (vVar1 == *pvVar5) {
        local_2c = armiesReceived();
        pDVar3 = deck_local;
        pvVar2 = givenCards_local;
        std::vector<CardType,_std::allocator<CardType>_>::vector(&local_48,givenCards);
        Deck::discard((Deck *)pvVar2,(Hand *)pDVar3,&local_48);
        std::vector<CardType,_std::allocator<CardType>_>::~vector(&local_48);
        globalHandVariables::tradedSetsCount = globalHandVariables::tradedSetsCount + 1;
        return local_2c;
      }
    }
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,0);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,1);
    if (vVar1 != *pvVar5) {
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,0);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,2);
      if (vVar1 != *pvVar5) {
        pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,1);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(givenCards,2);
        if (vVar1 != *pvVar5) {
          local_64 = armiesReceived();
          pDVar3 = deck_local;
          pvVar2 = givenCards_local;
          std::vector<CardType,_std::allocator<CardType>_>::vector
                    ((vector<CardType,_std::allocator<CardType>_> *)&handLength_1,givenCards);
          Deck::discard((Deck *)pvVar2,(Hand *)pDVar3,
                        (vector<CardType,_std::allocator<CardType>_> *)&handLength_1);
          std::vector<CardType,_std::allocator<CardType>_>::~vector
                    ((vector<CardType,_std::allocator<CardType>_> *)&handLength_1);
          globalHandVariables::tradedSetsCount = globalHandVariables::tradedSetsCount + 1;
          return local_64;
        }
      }
    }
  }
  return -1;
}

Assistant:

int Hand::exchange(Hand* hand, Deck* deck, std::vector<CardType> givenCards) {
    if (givenCards.size() != 3) {
        return -1;
    }
        //Ensure that all three given cards are the same
    else if (givenCards.at(0) == givenCards.at(1) && givenCards.at(1) == givenCards.at(2)) {
        int armiesToExchange = Hand::armiesReceived();

        try {
            deck->discard(hand, givenCards);
        } catch (const std::length_error& handLength) {
            std::cout << handLength.what() << std::endl;
            exit(1);
        }

        globalHandVariables::tradedSetsCount++;
        return armiesToExchange;
    }
        //Ensure that all three cards are different
    else if (givenCards.at(0) != givenCards.at(1) &&
             givenCards.at(0) != givenCards.at(2) &&
             givenCards.at(1) != givenCards.at(2)) {
        int armiesToExchange = Hand::armiesReceived();

        try {
            deck->discard(hand, givenCards);
        } catch (const std::length_error& handLength) {
            std::cout << handLength.what() << std::endl;
            exit(1);
        }

        globalHandVariables::tradedSetsCount++;
        return armiesToExchange;
    }
    return -1;
}